

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void boolean(ch_compilation *comp)

{
  ch_token_kind cVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  undefined4 *data_start;
  ch_op op_1;
  ch_op op;
  undefined4 local_8;
  undefined4 local_4;
  
  data_start = &local_8;
  cVar1 = (comp->previous).kind;
  if (cVar1 == TK_FALSE) {
    _local_8 = CONCAT44((int)((ulong)in_RAX >> 0x20),0xd);
  }
  else {
    if (cVar1 != TK_TRUE) {
      error(comp,"Expected boolean expression",in_RDX,in_RAX);
      return;
    }
    data_start = &local_4;
    _local_8 = CONCAT44(0xe,(int)in_RAX);
  }
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,data_start,1);
  return;
}

Assistant:

void boolean(ch_compilation* comp) {
  ch_token_kind kind = comp->previous.kind;

  switch(kind) {
    case TK_TRUE: 
      EMIT_OP(GET_EMIT(comp), OP_TRUE);
      return;
    case TK_FALSE: 
      EMIT_OP(GET_EMIT(comp), OP_FALSE);
      return;
    default:
      error(comp, "Expected boolean expression");
  }
}